

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CArmInstruction.cpp
# Opt level: O1

void __thiscall
CArmInstruction::CArmInstruction
          (CArmInstruction *this,tArmOpcode *sourceOpcode,ArmOpcodeVariables *vars)

{
  char *pcVar1;
  char *pcVar2;
  int64_t iVar3;
  undefined4 uVar4;
  
  CAssemblerCommand::CAssemblerCommand((CAssemblerCommand *)this);
  (this->super_ArmOpcodeCommand).super_CAssemblerCommand._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CArmInstruction_001bf4c0;
  (this->Vars).Shift.reg.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).Shift.reg.name._name._M_string_length = 0;
  (this->Vars).Shift.reg.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).Shift.reg.name._name.field_2 + 8) = 0;
  (this->Vars).Shift.reg.name._name._M_dataplus._M_p =
       (pointer)&(this->Vars).Shift.reg.name._name.field_2;
  (this->Vars).Shift.reg.name._name._M_string_length = 0;
  (this->Vars).Shift.reg.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).Shift.ShiftExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Vars).Shift.ShiftExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Vars).Shift.ShiftExpression.constExpression = true;
  (this->Vars).CopData.cd.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).CopData.cd.name._name._M_string_length = 0;
  (this->Vars).CopData.cd.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).CopData.cd.name._name.field_2 + 8) = 0;
  (this->Vars).CopData.cd.name._name._M_dataplus._M_p =
       (pointer)&(this->Vars).CopData.cd.name._name.field_2;
  (this->Vars).CopData.cd.name._name._M_string_length = 0;
  (this->Vars).CopData.cd.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).CopData.cn.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).CopData.cn.name._name._M_string_length = 0;
  (this->Vars).CopData.cn.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).CopData.cn.name._name.field_2 + 8) = 0;
  (this->Vars).CopData.cn.name._name._M_dataplus._M_p =
       (pointer)&(this->Vars).CopData.cn.name._name.field_2;
  (this->Vars).CopData.cn.name._name._M_string_length = 0;
  (this->Vars).CopData.cn.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).CopData.cm.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).CopData.cm.name._name._M_string_length = 0;
  (this->Vars).CopData.cm.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).CopData.cm.name._name.field_2 + 8) = 0;
  (this->Vars).CopData.cm.name._name._M_dataplus._M_p =
       (pointer)&(this->Vars).CopData.cm.name._name.field_2;
  (this->Vars).CopData.cm.name._name._M_string_length = 0;
  (this->Vars).CopData.cm.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).CopData.pn.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).CopData.pn.name._name.field_2 + 8) = 0;
  (this->Vars).CopData.pn.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).CopData.pn.name._name._M_string_length = 0;
  (this->Vars).CopData.pn.name._name._M_dataplus._M_p =
       (pointer)&(this->Vars).CopData.pn.name._name.field_2;
  (this->Vars).CopData.pn.name._name._M_string_length = 0;
  (this->Vars).CopData.pn.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).CopData.CpopExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Vars).CopData.CpopExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Vars).CopData.CpopExpression.constExpression = true;
  (this->Vars).CopData.CpinfExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Vars).CopData.CpinfExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Vars).CopData.CpinfExpression.constExpression = true;
  (this->Vars).rs.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rs.name._name.field_2 + 8) = 0;
  (this->Vars).rs.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).rs.name._name._M_string_length = 0;
  (this->Vars).rs.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rs.name._name.field_2;
  (this->Vars).rs.name._name._M_string_length = 0;
  (this->Vars).rs.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).rm.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rm.name._name.field_2 + 8) = 0;
  (this->Vars).rm.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).rm.name._name._M_string_length = 0;
  (this->Vars).rm.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rm.name._name.field_2;
  (this->Vars).rm.name._name._M_string_length = 0;
  (this->Vars).rm.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).rd.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rd.name._name.field_2 + 8) = 0;
  (this->Vars).rd.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).rd.name._name._M_string_length = 0;
  (this->Vars).rd.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rd.name._name.field_2;
  (this->Vars).rd.name._name._M_string_length = 0;
  (this->Vars).rd.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).rn.name._name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this->Vars).rn.name._name.field_2 + 8) = 0;
  (this->Vars).rn.name._name._M_dataplus._M_p = (pointer)0x0;
  (this->Vars).rn.name._name._M_string_length = 0;
  (this->Vars).rn.name._name._M_dataplus._M_p = (pointer)&(this->Vars).rn.name._name.field_2;
  (this->Vars).rn.name._name._M_string_length = 0;
  (this->Vars).rn.name._name.field_2._M_local_buf[0] = '\0';
  (this->Vars).ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->Vars).ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Vars).ImmediateExpression.constExpression = true;
  pcVar1 = sourceOpcode->name;
  pcVar2 = sourceOpcode->mask;
  uVar4 = *(undefined4 *)&sourceOpcode->field_0x14;
  iVar3 = sourceOpcode->flags;
  (this->Opcode).encoding = sourceOpcode->encoding;
  *(undefined4 *)&(this->Opcode).field_0x14 = uVar4;
  (this->Opcode).flags = iVar3;
  (this->Opcode).name = pcVar1;
  (this->Opcode).mask = pcVar2;
  ArmOpcodeVariables::operator=(&this->Vars,vars);
  this->arch = Arm.version;
  return;
}

Assistant:

CArmInstruction::CArmInstruction(const tArmOpcode& sourceOpcode, ArmOpcodeVariables& vars)
{
	this->Opcode = sourceOpcode;
	this->Vars = vars;
	arch = Arm.getVersion();
}